

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<slang::parsing::TokenKind_&,_slang::parsing::TokenKind_&>::
streamReconstructedExpression
          (BinaryExpr<slang::parsing::TokenKind_&,_slang::parsing::TokenKind_&> *this,ostream *os)

{
  StringRef op;
  TokenKind *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  ostream *in_stack_ffffffffffffffb0;
  char *pcVar1;
  pointer pcVar2;
  
  Detail::stringify<slang::parsing::TokenKind>(in_RSI);
  pcVar1 = *(char **)((long)&in_RDI->field_2 + 8);
  pcVar2 = in_RDI[1]._M_dataplus._M_p;
  Detail::stringify<slang::parsing::TokenKind>(in_RSI);
  op.m_size = (size_type)pcVar2;
  op.m_start = pcVar1;
  formatReconstructedExpression
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,op,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }